

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AS_DCP_TimedText.cpp
# Opt level: O0

void ASDCP::TimedText::DescriptorDump(TimedTextDescriptor *TDesc,FILE *stream)

{
  bool bVar1;
  char *pcVar2;
  undefined8 uVar3;
  size_type sVar4;
  reference pTVar5;
  char *pcVar6;
  _Self local_a0;
  _List_node_base *local_98;
  _List_const_iterator<ASDCP::TimedText::TimedTextResourceDescriptor> local_90;
  const_iterator ri;
  char local_78 [8];
  char buf [64];
  UUID TmpID;
  FILE *stream_local;
  TimedTextDescriptor *TDesc_local;
  
  TmpID.super_Identifier<16U>._24_8_ = stream;
  if (stream == (FILE *)0x0) {
    TmpID.super_Identifier<16U>._24_8_ = _stderr;
  }
  Kumu::UUID::UUID((UUID *)(buf + 0x38),TDesc->AssetID);
  fprintf((FILE *)TmpID.super_Identifier<16U>._24_8_,"              EditRate: %u/%u\n",
          (ulong)(uint)(TDesc->EditRate).Numerator,(ulong)(uint)(TDesc->EditRate).Denominator);
  fprintf((FILE *)TmpID.super_Identifier<16U>._24_8_,"     ContainerDuration: %u\n",
          (ulong)TDesc->ContainerDuration);
  pcVar2 = Kumu::UUID::EncodeHex((UUID *)(buf + 0x38),local_78,0x40);
  fprintf((FILE *)TmpID.super_Identifier<16U>._24_8_,"               AssetID: %s\n",pcVar2);
  uVar3 = std::__cxx11::string::c_str();
  fprintf((FILE *)TmpID.super_Identifier<16U>._24_8_,"         NamespaceName: %s\n",uVar3);
  sVar4 = std::__cxx11::
          list<ASDCP::TimedText::TimedTextResourceDescriptor,_std::allocator<ASDCP::TimedText::TimedTextResourceDescriptor>_>
          ::size(&TDesc->ResourceList);
  fprintf((FILE *)TmpID.super_Identifier<16U>._24_8_,"         ResourceCount: %zu\n",sVar4);
  uVar3 = std::__cxx11::string::c_str();
  fprintf((FILE *)TmpID.super_Identifier<16U>._24_8_,"RFC5646LanguageTagList: %s\n",uVar3);
  std::_List_const_iterator<ASDCP::TimedText::TimedTextResourceDescriptor>::_List_const_iterator
            (&local_90);
  local_98 = (_List_node_base *)
             std::__cxx11::
             list<ASDCP::TimedText::TimedTextResourceDescriptor,_std::allocator<ASDCP::TimedText::TimedTextResourceDescriptor>_>
             ::begin(&TDesc->ResourceList);
  local_90._M_node = local_98;
  while( true ) {
    local_a0._M_node =
         (_List_node_base *)
         std::__cxx11::
         list<ASDCP::TimedText::TimedTextResourceDescriptor,_std::allocator<ASDCP::TimedText::TimedTextResourceDescriptor>_>
         ::end(&TDesc->ResourceList);
    bVar1 = std::operator!=(&local_90,&local_a0);
    if (!bVar1) break;
    pTVar5 = std::_List_const_iterator<ASDCP::TimedText::TimedTextResourceDescriptor>::operator*
                       (&local_90);
    Kumu::Identifier<16U>::Set((Identifier<16U> *)(buf + 0x38),pTVar5->ResourceID);
    pcVar2 = Kumu::UUID::EncodeHex((UUID *)(buf + 0x38),local_78,0x40);
    pTVar5 = std::_List_const_iterator<ASDCP::TimedText::TimedTextResourceDescriptor>::operator*
                       (&local_90);
    pcVar6 = MIME2str(pTVar5->Type);
    fprintf((FILE *)TmpID.super_Identifier<16U>._24_8_,"    %s: %s\n",pcVar2,pcVar6);
    std::_List_const_iterator<ASDCP::TimedText::TimedTextResourceDescriptor>::operator++
              (&local_90,0);
  }
  Kumu::UUID::~UUID((UUID *)(buf + 0x38));
  return;
}

Assistant:

void
ASDCP::TimedText::DescriptorDump(ASDCP::TimedText::TimedTextDescriptor const& TDesc, FILE* stream)
{
  if ( stream == 0 )
    stream = stderr;

  UUID TmpID(TDesc.AssetID);
  char buf[64];

  fprintf(stream, "              EditRate: %u/%u\n", TDesc.EditRate.Numerator, TDesc.EditRate.Denominator);
  fprintf(stream, "     ContainerDuration: %u\n",    TDesc.ContainerDuration);
  fprintf(stream, "               AssetID: %s\n",    TmpID.EncodeHex(buf, 64));
  fprintf(stream, "         NamespaceName: %s\n",    TDesc.NamespaceName.c_str());
  fprintf(stream, "         ResourceCount: %zu\n",   TDesc.ResourceList.size());
  fprintf(stream, "RFC5646LanguageTagList: %s\n",    TDesc.RFC5646LanguageTagList.c_str());

  TimedText::ResourceList_t::const_iterator ri;
  for ( ri = TDesc.ResourceList.begin() ; ri != TDesc.ResourceList.end(); ri++ )
    {
      TmpID.Set((*ri).ResourceID);
      fprintf(stream, "    %s: %s\n",
	      TmpID.EncodeHex(buf, 64), 
	      MIME2str((*ri).Type));
    }
}